

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O2

string * __thiscall
mp::SolverOption::echo_with_value_abi_cxx11_(string *__return_storage_ptr__,SolverOption *this)

{
  int iVar1;
  MemoryWriter w;
  BasicMemoryWriter<char,_std::allocator<char>_> local_238;
  
  (*this->_vptr_SolverOption[0xe])();
  iVar1 = (*this->_vptr_SolverOption[2])(this);
  if ((char)iVar1 == '\0') {
    local_238.super_BasicWriter<char>.buffer_ = &local_238.buffer_.super_Buffer<char>;
    local_238.super_BasicWriter<char>._vptr_BasicWriter =
         (_func_int **)&PTR__BasicMemoryWriter_0025b1f8;
    local_238.buffer_.super_Buffer<char>.ptr_ = local_238.buffer_.data_;
    local_238.buffer_.super_Buffer<char>.size_ = 0;
    local_238.buffer_.super_Buffer<char>.capacity_ = 500;
    local_238.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0025b240;
    fmt::Buffer<char>::append<char>(local_238.super_BasicWriter<char>.buffer_," = ","");
    (*this->_vptr_SolverOption[0xc])(this,&local_238);
    fmt::BasicWriter<char>::c_str(&local_238.super_BasicWriter<char>);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_238);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string echo_with_value() {
    auto s = echo();
    if (!is_flag()) {
      fmt::MemoryWriter w;
      w << " = ";
      this->Write(w);
      s += w.c_str();
    }
    return s;
  }